

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptRegExp::GetFirstStringArg(Arguments *args,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptLibrary *this;
  Var pvVar2;
  JavascriptString *local_38;
  JavascriptString *jsString;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  
  if ((SUB84(args->Info,0) & 0xffffff) == 1) {
    this = ScriptContext::GetLibrary(scriptContext);
    args_local = (Arguments *)JavascriptLibrary::GetUndefinedDisplayString(this);
  }
  else {
    pvVar2 = Arguments::operator[](args,1);
    bVar1 = VarIs<Js::JavascriptString>(pvVar2);
    if (bVar1) {
      local_38 = UnsafeVarTo<Js::JavascriptString>(pvVar2);
    }
    else {
      local_38 = (JavascriptString *)0x0;
    }
    if (local_38 == (JavascriptString *)0x0) {
      pvVar2 = Arguments::operator[](args,1);
      args_local = (Arguments *)JavascriptConversion::ToString(pvVar2,scriptContext);
    }
    else {
      args_local = (Arguments *)local_38;
    }
  }
  return (JavascriptString *)args_local;
}

Assistant:

JavascriptString* JavascriptRegExp::GetFirstStringArg(Arguments& args, ScriptContext* scriptContext)
    {
        if (args.Info.Count == 1)
        {
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }
        else
        {
            JavascriptString *jsString = JavascriptOperators::TryFromVar<JavascriptString>(args[1]);
            if (jsString)
            {
                return jsString;
            }
            else
            {
                return JavascriptConversion::ToString(args[1], scriptContext);
            }
        }
    }